

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O0

PointType __thiscall jhu::thrax::PhrasalRule::terminalIndex<false>(PhrasalRule *this,PointType i)

{
  Span SVar1;
  const_iterator pvVar2;
  short local_44;
  short sStack_42;
  IndexType s;
  value_type *nt;
  const_iterator __end3;
  const_iterator __begin3;
  Rhs *__range3;
  PointType result;
  IndexType from;
  PointType i_local;
  PhrasalRule *this_local;
  
  SVar1 = SpanPair::get<false>(&(this->lhs).span);
  __range3._2_2_ = SVar1.start;
  if ((i < __range3._2_2_) || (__range3._4_2_ = SVar1.end, __range3._4_2_ <= i)) {
    this_local._6_2_ = -1;
  }
  else {
    __range3._0_2_ = i - __range3._2_2_;
    __end3 = std::array<jhu::thrax::NT,_4UL>::begin(&this->nts);
    pvVar2 = std::array<jhu::thrax::NT,_4UL>::end(&this->nts);
    for (; __end3 != pvVar2; __end3 = __end3 + 1) {
      SVar1 = SpanPair::get<false>(&__end3->span);
      local_44 = SVar1.start;
      if (local_44 <= i) {
        sStack_42 = SVar1.end;
        if (i < sStack_42) {
          return -1;
        }
        __range3._0_2_ = (short)__range3 - (sStack_42 - local_44);
      }
    }
    this_local._6_2_ = (short)__range3;
  }
  return this_local._6_2_;
}

Assistant:

PointType terminalIndex(PointType i) const {
    auto [from, to] = lhs.span.get<SourceSide>();
    if (i < from || i >= to) {
      return -1;
    }
    auto result = i;
    result -= from;
    for (const auto& nt : nts) {
      auto [s, e] = nt.span.get<SourceSide>();
      if (i < s) {
        continue;
      }
      if (i < e) {
        // in the NT
        return -1;
      }
      result -= (e - s);
    }
    return result;
  }